

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_crop.cpp
# Opt level: O2

int test_crop(Mat *a,int woffset,int hoffset,int coffset,int outw,int outh,int outc,int woffset2,
             int hoffset2,int coffset2)

{
  int iVar1;
  undefined4 in_register_0000000c;
  undefined4 in_register_00000014;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> weights;
  Option opt;
  ParamDict pd;
  
  ncnn::ParamDict::ParamDict(&pd);
  ncnn::ParamDict::set(&pd,0,woffset);
  ncnn::ParamDict::set(&pd,1,hoffset);
  ncnn::ParamDict::set(&pd,2,coffset);
  ncnn::ParamDict::set(&pd,3,outw);
  ncnn::ParamDict::set(&pd,4,outh);
  ncnn::ParamDict::set(&pd,5,outc);
  ncnn::ParamDict::set(&pd,6,woffset2);
  ncnn::ParamDict::set(&pd,7,hoffset2);
  ncnn::ParamDict::set(&pd,8,coffset2);
  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector(&weights,0,(allocator_type *)&opt);
  ncnn::Option::Option(&opt);
  opt.num_threads = 1;
  opt.use_int8_inference = false;
  opt.use_vulkan_compute = true;
  iVar1 = test_layer<ncnn::Crop>("Crop",&pd,&weights,&opt,a,0.001,(_func_void_Crop_ptr *)0x0);
  if (iVar1 != 0) {
    fprintf(_stderr,
            "test_crop failed a.dims=%d a=(%d %d %d) woffset=%d hoffset=%d coffset=%d outw=%d outh=%d outc=%d woffset2=%d hoffset2=%d coffset2=%d\n"
            ,(ulong)(uint)a->dims,(ulong)(uint)a->w,(ulong)(uint)a->h,(ulong)(uint)a->c,
            (ulong)(uint)woffset,CONCAT44(in_register_00000014,hoffset),
            CONCAT44(in_register_0000000c,coffset),(ulong)(uint)outw,(ulong)(uint)outh,
            (ulong)(uint)outc,(ulong)(uint)woffset2,(ulong)(uint)hoffset2,(ulong)(uint)coffset2);
  }
  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector(&weights);
  ncnn::ParamDict::~ParamDict(&pd);
  return iVar1;
}

Assistant:

static int test_crop(const ncnn::Mat& a, int woffset, int hoffset, int coffset, int outw, int outh, int outc, int woffset2, int hoffset2, int coffset2)
{
    ncnn::ParamDict pd;
    pd.set(0, woffset);// woffset
    pd.set(1, hoffset);// hoffset
    pd.set(2, coffset);// coffset
    pd.set(3, outw);// outw
    pd.set(4, outh);// outh
    pd.set(5, outc);// outc
    pd.set(6, woffset2);// woffset2
    pd.set(7, hoffset2);// hoffset2
    pd.set(8, coffset2);// coffset2

    std::vector<ncnn::Mat> weights(0);

    ncnn::Option opt;
    opt.num_threads = 1;
    opt.use_vulkan_compute = true;
    opt.use_int8_inference = false;

    int ret = test_layer<ncnn::Crop>("Crop", pd, weights, opt, a);
    if (ret != 0)
    {
        fprintf(stderr, "test_crop failed a.dims=%d a=(%d %d %d) woffset=%d hoffset=%d coffset=%d outw=%d outh=%d outc=%d woffset2=%d hoffset2=%d coffset2=%d\n", a.dims, a.w, a.h, a.c, woffset, hoffset, coffset, outw, outh, outc, woffset2, hoffset2, coffset2);
    }

    return ret;
}